

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

string * __thiscall
duckdb::ComplexJSON::GetValueRecursive_abi_cxx11_
          (string *__return_storage_ptr__,ComplexJSON *this,ComplexJSON *child)

{
  yyjson_val_pool *pyVar1;
  yyjson_alc *alc;
  yyjson_str_pool *pool;
  _Hash_node_base *__src;
  _Hash_node_base *__n;
  ulong uVar2;
  long lVar3;
  pointer pcVar4;
  _Alloc_hider __src_00;
  size_type __n_00;
  yyjson_mut_doc *this_00;
  type this_01;
  yyjson_mut_val *pyVar5;
  yyjson_mut_doc *extraout_RDX;
  ComplexJSON *child_00;
  yyjson_mut_doc *extraout_RDX_00;
  yyjson_mut_doc *extraout_RDX_01;
  yyjson_mut_doc *pyVar6;
  yyjson_mut_doc *extraout_RDX_02;
  yyjson_mut_doc *extraout_RDX_03;
  yyjson_mut_doc *extraout_RDX_04;
  yyjson_mut_doc *extraout_RDX_05;
  yyjson_mut_val *pyVar7;
  char *pcVar8;
  yyjson_mut_doc *pyVar9;
  yyjson_mut_val *pyVar10;
  _Hash_node_base *p_Var11;
  bool bVar12;
  string value_str;
  string local_50;
  
  if (this->is_object == true) {
    pyVar7 = (yyjson_mut_val *)0x0;
    this_00 = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
    pyVar6 = extraout_RDX;
    if (this_00 != (yyjson_mut_doc *)0x0) {
      pyVar1 = &this_00->val_pool;
      if (((this_00->val_pool).end != (this_00->val_pool).cur) ||
         (bVar12 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&this_00->alc,1),
         pyVar6 = extraout_RDX_05, bVar12)) {
        pyVar7 = pyVar1->cur;
        pyVar1->cur = pyVar7 + 1;
      }
      else {
        pyVar7 = (yyjson_mut_val *)0x0;
      }
      if (pyVar7 == (yyjson_mut_val *)0x0) {
        pyVar7 = (yyjson_mut_val *)0x0;
      }
      else {
        pyVar7->tag = 7;
      }
    }
    if (this_00 != (yyjson_mut_doc *)0x0) {
      this_00->root = pyVar7;
    }
    p_Var11 = (this->obj_value)._M_h._M_before_begin._M_nxt;
    if (p_Var11 != (_Hash_node_base *)0x0) {
      pyVar1 = &this_00->val_pool;
      alc = &this_00->alc;
      pool = &this_00->str_pool;
      do {
        if (this_00 == (yyjson_mut_doc *)0x0) {
LAB_0037e0b0:
          pyVar9 = (yyjson_mut_doc *)0x0;
        }
        else {
          __src = p_Var11[1]._M_nxt;
          pyVar9 = (yyjson_mut_doc *)0x0;
          if (__src != (_Hash_node_base *)0x0) {
            __n = p_Var11[2]._M_nxt;
            if (((this_00->val_pool).end != (this_00->val_pool).cur) ||
               (bVar12 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1), bVar12)) {
              pyVar6 = (yyjson_mut_doc *)pyVar1->cur;
              pyVar1->cur = (yyjson_mut_val *)((yyjson_val_uni *)&pyVar6->alc + 2);
            }
            else {
              pyVar6 = (yyjson_mut_doc *)0x0;
            }
            if ((__n < (_Hash_node_base *)((this_00->str_pool).end + -(long)(this_00->str_pool).cur)
                ) || (bVar12 = duckdb_yyjson::unsafe_yyjson_str_pool_grow
                                         (pool,alc,(usize)((long)&__n->_M_nxt + 1)), bVar12)) {
              pcVar8 = pool->cur;
              pool->cur = pcVar8 + (long)((long)&__n->_M_nxt + 1);
            }
            else {
              pcVar8 = (char *)0x0;
            }
            if (pcVar8 == (char *)0x0) {
              pcVar8 = (char *)0x0;
            }
            else {
              switchD_00b1422a::default(pcVar8,__src,(size_t)__n);
              pcVar8[(long)__n] = '\0';
            }
            if (pyVar6 == (yyjson_mut_doc *)0x0) goto LAB_0037e0b0;
            pyVar9 = (yyjson_mut_doc *)0x0;
            if (pcVar8 != (char *)0x0) {
              pyVar6->root = (yyjson_mut_val *)((long)__n << 8 | 5);
              ((yyjson_val_uni *)&pyVar6->alc)->ptr = pcVar8;
              pyVar9 = pyVar6;
            }
          }
        }
        this_01 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
                  operator*((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                             *)(p_Var11 + 5));
        GetValueRecursive_abi_cxx11_(&local_50,this_01,child_00);
        __n_00 = local_50._M_string_length;
        __src_00._M_p = local_50._M_dataplus._M_p;
        pyVar6 = extraout_RDX_00;
        if (this_00 == (yyjson_mut_doc *)0x0) {
LAB_0037e0b8:
          pyVar5 = (yyjson_mut_val *)0x0;
        }
        else {
          pyVar5 = (yyjson_mut_val *)0x0;
          if (local_50._M_dataplus._M_p != (pointer)0x0) {
            if (((this_00->val_pool).end != (this_00->val_pool).cur) ||
               (bVar12 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1),
               pyVar6 = extraout_RDX_03, bVar12)) {
              pyVar10 = pyVar1->cur;
              pyVar1->cur = pyVar10 + 1;
            }
            else {
              pyVar10 = (yyjson_mut_val *)0x0;
            }
            if ((__n_00 < (ulong)((long)(this_00->str_pool).end - (long)(this_00->str_pool).cur)) ||
               (bVar12 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pool,alc,__n_00 + 1),
               pyVar6 = extraout_RDX_04, bVar12)) {
              pcVar8 = pool->cur;
              pool->cur = pcVar8 + __n_00 + 1;
            }
            else {
              pcVar8 = (char *)0x0;
            }
            if (pcVar8 == (char *)0x0) {
              pcVar8 = (char *)0x0;
            }
            else {
              switchD_00b1422a::default(pcVar8,__src_00._M_p,__n_00);
              pcVar8[__n_00] = '\0';
              pyVar6 = extraout_RDX_01;
            }
            if (pyVar10 == (yyjson_mut_val *)0x0) goto LAB_0037e0b8;
            pyVar5 = (yyjson_mut_val *)0x0;
            if (pcVar8 != (char *)0x0) {
              pyVar10->tag = __n_00 << 8 | 5;
              (pyVar10->uni).ptr = pcVar8;
              pyVar5 = pyVar10;
            }
          }
        }
        if ((pyVar7 != (yyjson_mut_val *)0x0) && ((~(uint)pyVar7->tag & 7) == 0)) {
          if (pyVar9 == (yyjson_mut_doc *)0x0) {
            bVar12 = false;
          }
          else {
            bVar12 = ((ulong)pyVar9->root & 7) == 5;
          }
          if ((bVar12) && (pyVar5 != (yyjson_mut_val *)0x0)) {
            uVar2 = pyVar7->tag;
            pyVar6 = pyVar9;
            if (0xff < uVar2) {
              lVar3 = *(long *)((pyVar7->uni).u64 + 0x10);
              pyVar6 = *(yyjson_mut_doc **)(lVar3 + 0x10);
              *(yyjson_mut_doc **)(lVar3 + 0x10) = pyVar9;
            }
            pyVar5->next = (yyjson_mut_val *)pyVar6;
            ((yyjson_val_uni *)&pyVar9->alc)[1].u64 = (uint64_t)pyVar5;
            (pyVar7->uni).str = (char *)pyVar9;
            pyVar7->tag = (uVar2 & 0xff) + (uVar2 & 0xffffffffffffff00) + 0x100;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
          pyVar6 = extraout_RDX_02;
        }
        p_Var11 = p_Var11->_M_nxt;
      } while (p_Var11 != (_Hash_node_base *)0x0);
    }
    WriteJsonToString_abi_cxx11_(__return_storage_ptr__,(duckdb *)this_00,pyVar6);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (this->str_value)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar4 + (this->str_value)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string ComplexJSON::GetValueRecursive(const ComplexJSON &child) {
	if (child.is_object) {
		// We have to construct the nested json
		yyjson_mut_doc *doc = yyjson_mut_doc_new(nullptr);
		yyjson_mut_val *root = yyjson_mut_obj(doc);
		yyjson_mut_doc_set_root(doc, root);
		for (const auto &object : child.obj_value) {
			auto key = yyjson_mut_strncpy(doc, object.first.c_str(), object.first.size());
			auto value_str = GetValueRecursive(*object.second);
			auto value = yyjson_mut_strncpy(doc, value_str.c_str(), value_str.size());
			yyjson_mut_obj_add(root, key, value);
		}
		return WriteJsonToString(doc);
	} else {
		// simple string we can just write
		return child.str_value;
	}
}